

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O3

int check_flow_timeout(pcp_flow_t *f,void *timeout)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  timeval local_38;
  
  if (((f->timeout).tv_sec != 0) || ((f->timeout).tv_usec != 0)) {
    gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    lVar4 = (f->timeout).tv_usec;
    lVar1 = lVar4 / 1000000 + (f->timeout).tv_sec;
    (f->timeout).tv_sec = lVar1;
    uVar3 = lVar4 % 1000000;
    (f->timeout).tv_usec = uVar3;
    if ((long)uVar3 < 0) {
      uVar3 = uVar3 + 1000000;
      (f->timeout).tv_usec = uVar3;
      lVar1 = lVar1 + -1;
      (f->timeout).tv_sec = lVar1;
    }
    lVar4 = local_38.tv_usec / 1000000 + local_38.tv_sec;
    uVar5 = local_38.tv_usec % 1000000;
    if ((long)uVar5 < 0) {
      uVar5 = uVar5 + 1000000;
      lVar4 = lVar4 + -1;
      local_38.tv_sec = lVar4;
      local_38.tv_usec = uVar5;
    }
    if ((lVar1 < lVar4) || ((lVar1 <= lVar4 && (uVar3 <= uVar5)))) {
      if (f->state == pfs_wait_resp) {
        pcp_logger(PCP_LOGLVL_WARN,"Recv of PCP response for flow %d timed out.",
                   (ulong)f->key_bucket);
      }
      handle_flow_event(f,fev_flow_timedout,(pcp_recv_msg_t *)0x0);
      lVar1 = (f->timeout).tv_sec;
      uVar3 = (f->timeout).tv_usec;
    }
    if (lVar1 != 0 || uVar3 != 0) {
      lVar1 = lVar1 + (long)uVar3 / 1000000;
      (f->timeout).tv_sec = lVar1;
      uVar3 = (long)uVar3 % 1000000;
      (f->timeout).tv_usec = uVar3;
      if ((long)uVar3 < 0) {
        uVar3 = uVar3 + 1000000;
        (f->timeout).tv_usec = uVar3;
        lVar1 = lVar1 + -1;
        (f->timeout).tv_sec = lVar1;
      }
      if ((lVar1 < lVar4) || ((lVar1 <= lVar4 && (uVar3 <= uVar5)))) {
        local_38.tv_sec = 0;
        local_38.tv_usec = 0;
      }
      else {
        iVar2 = (int)uVar5 + -1000000;
        if (uVar5 <= uVar3) {
          iVar2 = (int)uVar5;
        }
        iVar2 = (int)uVar3 - iVar2;
        local_38.tv_sec = ((lVar1 - lVar4) - (ulong)(uVar3 < uVar5)) + (long)(iVar2 / 1000000);
        iVar2 = iVar2 % 1000000;
        local_38.tv_usec = (__suseconds_t)iVar2;
        if (iVar2 < 0) {
          local_38.tv_usec = local_38.tv_usec + 1000000;
          local_38.tv_sec = local_38.tv_sec + -1;
        }
      }
      if ((*timeout != 0) || (*(long *)((long)timeout + 8) != 0)) {
        lVar4 = *timeout + *(long *)((long)timeout + 8) / 1000000;
        *(long *)timeout = lVar4;
        uVar3 = *(long *)((long)timeout + 8) % 1000000;
        *(ulong *)((long)timeout + 8) = uVar3;
        if ((long)uVar3 < 0) {
          uVar3 = uVar3 + 1000000;
          *(ulong *)((long)timeout + 8) = uVar3;
          lVar4 = lVar4 + -1;
          *(long *)timeout = lVar4;
        }
        if (lVar4 <= local_38.tv_sec) {
          if (lVar4 < local_38.tv_sec) {
            return 0;
          }
          if (uVar3 <= (ulong)local_38.tv_usec) {
            return 0;
          }
        }
      }
      *(__time_t *)timeout = local_38.tv_sec;
      *(__suseconds_t *)((long)timeout + 8) = local_38.tv_usec;
    }
  }
  return 0;
}

Assistant:

static int check_flow_timeout(pcp_flow_t *f, void *timeout) {
    struct timeval *tout = timeout;
    struct timeval ctv;

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) <= 0) {
        // timed out
        if (f->state == pfs_wait_resp) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Recv of PCP response for flow %d timed out.",
                    f->key_bucket);
        }
        handle_flow_event(f, fev_flow_timedout, NULL);
    }

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    timeval_subtract(&ctv, &f->timeout, &ctv);

    if ((tout->tv_sec == 0) && (tout->tv_usec == 0)) {
        *tout = ctv;
        return 0;
    }

    if (timeval_comp(&ctv, tout) < 0) {
        *tout = ctv;
    }

    return 0;
}